

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lzma2Dec.c
# Opt level: O0

SRes Lzma2Dec_GetOldProps(Byte prop,Byte *props)

{
  int local_18;
  UInt32 dicSize;
  Byte *props_local;
  Byte prop_local;
  SRes local_4;
  
  if (prop < 0x29) {
    if (prop == '(') {
      local_18 = -1;
    }
    else {
      local_18 = (prop & 1 | 2) << (prop / 2 + 0xb & 0x1f);
    }
    *props = '\x04';
    props[1] = (Byte)local_18;
    props[2] = (Byte)((uint)local_18 >> 8);
    props[3] = (Byte)((uint)local_18 >> 0x10);
    props[4] = (Byte)((uint)local_18 >> 0x18);
    local_4 = 0;
  }
  else {
    local_4 = 4;
  }
  return local_4;
}

Assistant:

static SRes Lzma2Dec_GetOldProps(Byte prop, Byte *props)
{
  UInt32 dicSize;
  if (prop > 40)
    return SZ_ERROR_UNSUPPORTED;
  dicSize = (prop == 40) ? 0xFFFFFFFF : LZMA2_DIC_SIZE_FROM_PROP(prop);
  props[0] = (Byte)LZMA2_LCLP_MAX;
  props[1] = (Byte)(dicSize);
  props[2] = (Byte)(dicSize >> 8);
  props[3] = (Byte)(dicSize >> 16);
  props[4] = (Byte)(dicSize >> 24);
  return SZ_OK;
}